

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

void __thiscall
TileSwitch::TileSwitch
          (TileSwitch *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,char charID,
          State state)

{
  int iVar1;
  mapped_type *pmVar2;
  Vector2u *pVVar3;
  byte in_CL;
  Tile *in_RDI;
  char in_R8B;
  undefined4 in_R9D;
  float x;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  undefined2 uVar4;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffd3f;
  undefined1 uVar6;
  Text *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  Tile *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd68;
  uint uVar7;
  Transformable *this_00;
  Font *in_stack_fffffffffffffd70;
  String *in_stack_fffffffffffffd78;
  Text *in_stack_fffffffffffffd80;
  locale *this_01;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  String *in_stack_fffffffffffffd90;
  allocator *this_02;
  locale local_230 [15];
  allocator local_221;
  string local_220 [80];
  locale local_1d0 [432];
  undefined4 local_20;
  char local_1a;
  byte local_19;
  
  uVar7 = (uint)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_19 = in_CL & 1;
  local_20 = in_R9D;
  local_1a = in_R8B;
  Tile::Tile(in_stack_fffffffffffffd50,
             (Board *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (Vector2u *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
             (bool)in_stack_fffffffffffffd3e);
  in_RDI->_vptr_Tile = (_func_int **)&PTR__TileSwitch_002bbfc8;
  in_RDI->field_0x21 = local_1a;
  *(undefined4 *)&in_RDI->field_0x24 = local_20;
  std::
  unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
  ::operator[]((unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
                *)in_stack_fffffffffffffd40,
               (key_type *)
               CONCAT17(in_stack_fffffffffffffd3f,
                        CONCAT16(in_stack_fffffffffffffd3e,
                                 CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::push_back
            ((vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *)in_stack_fffffffffffffd40,
             (value_type *)
             CONCAT17(in_stack_fffffffffffffd3f,
                      CONCAT16(in_stack_fffffffffffffd3e,
                               CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  std::locale::locale(local_1d0);
  sf::String::String(in_stack_fffffffffffffd90,
                     (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (locale *)in_stack_fffffffffffffd80);
  Board::getFont();
  sf::Text::Text(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,uVar7
                );
  std::
  unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
  ::operator[]((unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
                *)in_stack_fffffffffffffd40,
               (key_type *)
               CONCAT17(in_stack_fffffffffffffd3f,
                        CONCAT16(in_stack_fffffffffffffd3e,
                                 CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  sf::Text::operator=(in_stack_fffffffffffffd40,
                      (Text *)CONCAT17(in_stack_fffffffffffffd3f,
                                       CONCAT16(in_stack_fffffffffffffd3e,
                                                CONCAT24(in_stack_fffffffffffffd3c,
                                                         in_stack_fffffffffffffd38))));
  sf::Text::~Text(in_stack_fffffffffffffd40);
  sf::String::~String((String *)0x19f307);
  std::locale::~locale(local_1d0);
  std::
  unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
  ::operator[]((unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
                *)in_stack_fffffffffffffd40,
               (key_type *)
               CONCAT17(in_stack_fffffffffffffd3f,
                        CONCAT16(in_stack_fffffffffffffd3e,
                                 CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  iVar1 = (int)local_1a;
  this_02 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,1,(char)iVar1,this_02);
  this_01 = local_230;
  std::locale::locale(this_01);
  sf::String::String((String *)this_02,(string *)CONCAT44(iVar1,in_stack_fffffffffffffd88),this_01);
  sf::Text::setString(in_stack_fffffffffffffd40,
                      (String *)
                      CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ))));
  sf::String::~String((String *)0x19f3d1);
  std::locale::~locale(local_230);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  pmVar2 = std::
           unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
           ::operator[]((unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
                         *)in_stack_fffffffffffffd40,
                        (key_type *)
                        CONCAT17(in_stack_fffffffffffffd3f,
                                 CONCAT16(in_stack_fffffffffffffd3e,
                                          CONCAT24(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38))));
  this_00 = &pmVar2->super_Transformable;
  pVVar3 = Tile::getPosition(in_RDI);
  uVar7 = pVVar3->x;
  pVVar3 = Board::getTileSize();
  x = (float)(uVar7 * pVVar3->x) + 9.0;
  pVVar3 = Tile::getPosition(in_RDI);
  uVar7 = pVVar3->y;
  uVar4 = (undefined2)uVar7;
  uVar5 = (undefined1)(uVar7 >> 0x10);
  uVar6 = (undefined1)(uVar7 >> 0x18);
  pVVar3 = Board::getTileSize();
  sf::Transformable::setPosition
            (this_00,x,(float)(CONCAT13(uVar6,CONCAT12(uVar5,uVar4)) * pVVar3->y) + -2.0);
  (*in_RDI->_vptr_Tile[8])(in_RDI,0,(ulong)(local_19 & 1));
  return;
}

Assistant:

TileSwitch::TileSwitch(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, char charID, State state) : Tile(boardPtr, position, true, true) {
    _charID = charID;
    _state = state;
    boardPtr->switchKeybinds[charID].push_back(this);
    boardPtr->tileLabels[this] = Text("", Board::getFont(), 25);
    boardPtr->tileLabels[this].setString(string(1, charID));
    boardPtr->tileLabels[this].setPosition(getPosition().x * Board::getTileSize().x + 9.0f, getPosition().y * Board::getTileSize().y - 2.0f);
    addUpdate(false, noAdjacentUpdates);
}